

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSIMDReplace
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,SIMDReplaceOp op,uint8_t lane)

{
  SIMDReplace *pSVar1;
  bool bVar2;
  Ok local_b5;
  uint local_b4;
  Err local_b0;
  Err *local_80;
  Err *err;
  Result<wasm::Ok> _val;
  SIMDReplace curr;
  uint8_t lane_local;
  SIMDReplaceOp op_local;
  IRBuilder *this_local;
  
  pSVar1 = (SIMDReplace *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  SIMDReplace::SIMDReplace(pSVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitSIMDReplace
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pSVar1);
  local_80 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_80 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_b0,local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  local_b4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_b4 == 0) {
    pSVar1 = Builder::makeSIMDReplace
                       (&this->builder,op,(Expression *)curr._16_8_,lane,(Expression *)curr._32_8_);
    push(this,(Expression *)pSVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_b5);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSIMDReplace(SIMDReplaceOp op, uint8_t lane) {
  SIMDReplace curr;
  curr.op = op;
  CHECK_ERR(visitSIMDReplace(&curr));
  push(builder.makeSIMDReplace(op, curr.vec, lane, curr.value));
  return Ok{};
}